

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

PixelSensor *
pbrt::PixelSensor::Create
          (ParameterDictionary *parameters,RGBColorSpace *colorSpace,Float exposureTime,FileLoc *loc
          ,Allocator alloc)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  string *in_RDI;
  float in_XMM0_Da;
  Float FVar6;
  SpectrumHandle b;
  SpectrumHandle g;
  SpectrumHandle r;
  Float imagingRatio;
  string sensorName;
  Float whiteBalanceTemp;
  Float C;
  Float ISO;
  Float fNumber;
  string *in_stack_fffffffffffffd78;
  ParameterDictionary *in_stack_fffffffffffffd80;
  float *in_stack_fffffffffffffd88;
  float *in_stack_fffffffffffffd90;
  undefined5 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9d;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffda0;
  undefined6 in_stack_fffffffffffffda8;
  allocator<char> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 in_stack_fffffffffffffdc8;
  string *name;
  ParameterDictionary *this_00;
  string local_1d8 [32];
  TaggedPointer local_1b8 [8];
  string local_1b0 [32];
  TaggedPointer local_190 [8];
  string local_188 [32];
  TaggedPointer local_168 [12];
  undefined4 local_15c;
  float local_158;
  undefined1 local_151 [40];
  undefined1 local_129 [33];
  string local_108 [39];
  undefined1 local_e1 [40];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  Float local_70;
  allocator<char> local_59;
  string local_58 [36];
  Float local_34;
  float local_24;
  string *local_18;
  PixelSensor *local_8;
  
  local_24 = in_XMM0_Da;
  local_18 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  FVar6 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0.0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  local_34 = FVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  FVar6 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0.0);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  local_70 = FVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  FVar6 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0.0);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  this_00 = (ParameterDictionary *)local_e1;
  name = local_18;
  local_b8._32_4_ = FVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  FVar6 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0.0);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_129;
  local_e1._33_4_ = FVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)local_18,in_stack_fffffffffffffdb0);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)local_18,(allocator<char> *)args);
  ParameterDictionary::GetOneString
            (this_00,name,(string *)CONCAT44(FVar6,in_stack_fffffffffffffdc8));
  std::__cxx11::string::~string((string *)(local_151 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  std::__cxx11::string::~string((string *)(local_129 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_129);
  uVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
  if ((((bool)uVar1) && ((float)local_e1._33_4_ == 0.0)) && (!NAN((float)local_e1._33_4_))) {
    local_e1._33_4_ = 6500.0;
  }
  local_158 = (local_24 * 3.1415927 * local_70 * 683.0) /
              ((float)local_b8._32_4_ * local_34 * local_34);
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
  if ((bool)uVar2) {
    local_8 = pstd::pmr::polymorphic_allocator<std::byte>::
              new_object<pbrt::PixelSensor,pbrt::RGBColorSpace_const*&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                        (in_stack_fffffffffffffda0,
                         (RGBColorSpace **)
                         CONCAT17(in_stack_fffffffffffffd9f,
                                  CONCAT16(in_stack_fffffffffffffd9e,
                                           CONCAT15(in_stack_fffffffffffffd9d,
                                                    in_stack_fffffffffffffd98))),
                         in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                         (polymorphic_allocator<std::byte> *)in_stack_fffffffffffffd80);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffda8)),
                   (char *)in_stack_fffffffffffffda0);
    GetNamedSpectrum((string *)
                     CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,
                                       CONCAT15(in_stack_fffffffffffffd9d,in_stack_fffffffffffffd98)
                                      )));
    std::__cxx11::string::~string(local_188);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffda8)),
                   (char *)in_stack_fffffffffffffda0);
    GetNamedSpectrum((string *)
                     CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,
                                       CONCAT15(in_stack_fffffffffffffd9d,in_stack_fffffffffffffd98)
                                      )));
    std::__cxx11::string::~string(local_1b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffda8)),
                   (char *)in_stack_fffffffffffffda0);
    GetNamedSpectrum((string *)
                     CONCAT17(in_stack_fffffffffffffd9f,
                              CONCAT16(in_stack_fffffffffffffd9e,
                                       CONCAT15(in_stack_fffffffffffffd9d,in_stack_fffffffffffffd98)
                                      )));
    std::__cxx11::string::~string(local_1d8);
    uVar3 = pbrt::TaggedPointer::operator_cast_to_bool(local_168);
    if (((!(bool)uVar3) ||
        (uVar4 = pbrt::TaggedPointer::operator_cast_to_bool(local_190), !(bool)uVar4)) ||
       (bVar5 = pbrt::TaggedPointer::operator_cast_to_bool(local_1b8), !bVar5)) {
      ErrorExit<std::__cxx11::string&>((FileLoc *)this,(char *)local_18,args);
    }
    local_8 = pstd::pmr::polymorphic_allocator<std::byte>::
              new_object<pbrt::PixelSensor,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,pbrt::SpectrumHandle&,pbrt::RGBColorSpace_const*&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
                        ((polymorphic_allocator<std::byte> *)this,(SpectrumHandle *)local_18,
                         (SpectrumHandle *)args,
                         (SpectrumHandle *)CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffda8))
                         ,(RGBColorSpace **)in_stack_fffffffffffffda0,
                         (float *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(bVar5,
                                                  in_stack_fffffffffffffd98))),(float *)name,
                         (polymorphic_allocator<std::byte> *)this_00);
  }
  local_15c = 1;
  std::__cxx11::string::~string(local_108);
  return local_8;
}

Assistant:

PixelSensor *PixelSensor::Create(const ParameterDictionary &parameters,
                                 const RGBColorSpace *colorSpace, Float exposureTime,
                                 const FileLoc *loc, Allocator alloc) {
    // Imaging ratio parameters
    // The defaults here represent a "passthrough" setup such that the imaging
    // ratio will be exactly 1. This is a useful default since scenes that
    // weren't authored with a physical camera in mind will render as expected.
    Float fNumber = parameters.GetOneFloat("fnumber", 1.);
    Float ISO = parameters.GetOneFloat("iso", 100.);
    // Note: in the talk we mention using 312.5 for historical reasons. The
    // choice of 100 * Pi here just means that the other parameters make nice
    // "round" numbers like 1 and 100.
    Float C = parameters.GetOneFloat("c", 100.0 * Pi);
    Float whiteBalanceTemp = parameters.GetOneFloat("whitebalance", 0);

    std::string sensorName = parameters.GetOneString("sensor", "cie1931");

    // Pass through 0 for cie1931 if it's unspecified so that it doesn't do
    // any white balancing. For actual sensors, 6500 is the default...
    if (sensorName != "cie1931" && whiteBalanceTemp == 0)
        whiteBalanceTemp = 6500;

    Float imagingRatio = Pi * exposureTime * ISO * K_m / (C * fNumber * fNumber);

    if (sensorName == "cie1931") {
        return alloc.new_object<PixelSensor>(colorSpace, whiteBalanceTemp, imagingRatio,
                                             alloc);
    } else {
        SpectrumHandle r = GetNamedSpectrum(sensorName + "_r");
        SpectrumHandle g = GetNamedSpectrum(sensorName + "_g");
        SpectrumHandle b = GetNamedSpectrum(sensorName + "_b");

        if (!r || !g || !b)
            ErrorExit(loc, "%s: unknown sensor type", sensorName);

        return alloc.new_object<PixelSensor>(r, g, b, colorSpace, whiteBalanceTemp,
                                             imagingRatio, alloc);
    }
}